

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  parse_context local_288;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_268;
  undefined **local_248;
  undefined1 *local_240;
  long lStack_238;
  ulong local_230;
  undefined1 local_228 [536];
  
  lStack_238 = 0;
  local_248 = &PTR_grow_0014e470;
  local_230 = 500;
  local_288.format_str_.data_ = (char *)0x0;
  local_288.format_str_.size_ = 0;
  local_288.next_arg_id_ = 0;
  local_268.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_248;
  local_268.args_.desc_ = 0;
  local_268.loc_.locale_ = (void *)0x0;
  local_240 = local_228;
  (*h.custom_.format)(h.custom_.value,&local_288,&local_268);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_240,local_240 + lStack_238);
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }